

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O3

void PrintSerialPortIRQ(uint8_t irq)

{
  int iVar1;
  undefined7 in_register_00000039;
  char *__format;
  
  iVar1 = (int)CONCAT71(in_register_00000039,irq);
  if (iVar1 == 2) {
    __format = "Reserved";
  }
  else if (iVar1 == 1) {
    __format = "No IRQ";
  }
  else {
    if (iVar1 != 0) {
      printf("IRQ %d",irq);
      return;
    }
    __format = "Auto";
  }
  printf(__format);
  return;
}

Assistant:

void PrintSerialPortIRQ(uint8_t irq)
{
	switch(irq)
	{
	case 0:
		printf("Auto");
		break;
	case 1:
		printf("No IRQ");
		break;
	case 2:
		printf("Reserved");
		break;
	default:
		printf("IRQ %d", irq);
		break;
	}
}